

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_everything_together.cxx
# Opt level: O1

void __thiscall
simple_state_mgr::simple_state_mgr
          (simple_state_mgr *this,int32 srv_id,
          vector<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
          *cluster)

{
  char *pcVar1;
  char acStack_98 [104];
  char *local_30;
  
  (this->super_state_mgr)._vptr_state_mgr = (_func_int **)&PTR__simple_state_mgr_001787a0;
  this->srv_id_ = srv_id;
  std::
  vector<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
  ::vector(&this->cluster_,cluster);
  (this->store_path_)._M_dataplus._M_p = (pointer)&(this->store_path_).field_2;
  (this->store_path_)._M_string_length = 0;
  (this->store_path_).field_2._M_local_buf[0] = '\0';
  local_30 = "store%d";
  snprintf(acStack_98,100,"store%d",(ulong)(uint)this->srv_id_);
  pcVar1 = (char *)(this->store_path_)._M_string_length;
  strlen(acStack_98);
  std::__cxx11::string::_M_replace((ulong)&this->store_path_,0,pcVar1,(ulong)acStack_98);
  return;
}

Assistant:

simple_state_mgr(int32 srv_id, const std::vector<ptr<srv_config>>& cluster) : srv_id_(srv_id), cluster_(cluster)
    {
        store_path_ = sstrfmt("store%d").fmt(srv_id_);
    }